

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinExport::WriteBinaryScene(AssbinExport *this,IOStream *container,aiScene *scene)

{
  uint uVar1;
  ulong uVar2;
  uint32_t t;
  AssbinChunkWriter chunk;
  uint local_64;
  AssbinChunkWriter local_60;
  
  local_60.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0080c0c8;
  local_60.buffer = (uint8_t *)0x0;
  local_60.magic = 0x1239;
  local_60.cur_size = 0;
  local_60.cursor = 0;
  local_60.initial = 0x1000;
  uVar1 = scene->mFlags;
  local_60.container = container;
  AssbinChunkWriter::Grow(&local_60,4);
  *(uint *)(local_60.buffer + local_60.cursor) = uVar1;
  local_60.cursor = local_60.cursor + 4;
  local_64 = scene->mNumMeshes;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  local_64 = scene->mNumMaterials;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  local_64 = scene->mNumAnimations;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  local_64 = scene->mNumTextures;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  local_64 = scene->mNumLights;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  local_64 = scene->mNumCameras;
  (*local_60.super_IOStream._vptr_IOStream[3])(&local_60,&local_64,4,1);
  WriteBinaryNode(this,&local_60.super_IOStream,scene->mRootNode);
  if (scene->mNumMeshes != 0) {
    uVar2 = 0;
    do {
      WriteBinaryMesh(this,&local_60.super_IOStream,scene->mMeshes[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < scene->mNumMeshes);
  }
  if (scene->mNumMaterials != 0) {
    uVar2 = 0;
    do {
      WriteBinaryMaterial(this,&local_60.super_IOStream,scene->mMaterials[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < scene->mNumMaterials);
  }
  if (scene->mNumAnimations != 0) {
    uVar2 = 0;
    do {
      WriteBinaryAnim(this,&local_60.super_IOStream,scene->mAnimations[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < scene->mNumAnimations);
  }
  if (scene->mNumTextures != 0) {
    uVar2 = 0;
    do {
      WriteBinaryTexture(this,&local_60.super_IOStream,scene->mTextures[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < scene->mNumTextures);
  }
  if (scene->mNumLights != 0) {
    uVar2 = 0;
    do {
      WriteBinaryLight(this,&local_60.super_IOStream,scene->mLights[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < scene->mNumLights);
  }
  if (scene->mNumCameras != 0) {
    uVar2 = 0;
    do {
      WriteBinaryCamera(this,&local_60.super_IOStream,scene->mCameras[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < scene->mNumCameras);
  }
  AssbinChunkWriter::~AssbinChunkWriter(&local_60);
  return;
}

Assistant:

void WriteBinaryScene( IOStream * container, const aiScene* scene)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AISCENE );

        // basic scene information
        Write<unsigned int>(&chunk,scene->mFlags);
        Write<unsigned int>(&chunk,scene->mNumMeshes);
        Write<unsigned int>(&chunk,scene->mNumMaterials);
        Write<unsigned int>(&chunk,scene->mNumAnimations);
        Write<unsigned int>(&chunk,scene->mNumTextures);
        Write<unsigned int>(&chunk,scene->mNumLights);
        Write<unsigned int>(&chunk,scene->mNumCameras);

        // write node graph
        WriteBinaryNode( &chunk, scene->mRootNode );

        // write all meshes
        for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
            const aiMesh* mesh = scene->mMeshes[i];
            WriteBinaryMesh( &chunk,mesh);
        }

        // write materials
        for (unsigned int i = 0; i< scene->mNumMaterials; ++i) {
            const aiMaterial* mat = scene->mMaterials[i];
            WriteBinaryMaterial(&chunk,mat);
        }

        // write all animations
        for (unsigned int i = 0; i < scene->mNumAnimations;++i) {
            const aiAnimation* anim = scene->mAnimations[i];
            WriteBinaryAnim(&chunk,anim);
        }


        // write all textures
        for (unsigned int i = 0; i < scene->mNumTextures;++i) {
            const aiTexture* mesh = scene->mTextures[i];
            WriteBinaryTexture(&chunk,mesh);
        }

        // write lights
        for (unsigned int i = 0; i < scene->mNumLights;++i) {
            const aiLight* l = scene->mLights[i];
            WriteBinaryLight(&chunk,l);
        }

        // write cameras
        for (unsigned int i = 0; i < scene->mNumCameras;++i) {
            const aiCamera* cam = scene->mCameras[i];
            WriteBinaryCamera(&chunk,cam);
        }

    }